

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *pIVar1;
  uint uVar2;
  ImDrawChannel *pIVar3;
  unsigned_short *__src;
  ImDrawChannel *pIVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  long lVar11;
  long lVar12;
  ImDrawCmd *pIVar13;
  unsigned_short *__dest;
  int iVar14;
  long lVar15;
  int iVar16;
  ImDrawCmd *pIVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  unsigned_short *local_40;
  
  if (this->_Count < 2) {
    return;
  }
  iVar20 = 0;
  SetCurrentChannel(this,draw_list,0);
  ImDrawList::_PopUnusedDrawCmd(draw_list);
  if ((this->_Count < 1) || (lVar11 = (long)(draw_list->CmdBuffer).Size, lVar11 < 1)) {
    pIVar17 = (ImDrawCmd *)0x0;
  }
  else {
    pIVar17 = (draw_list->CmdBuffer).Data + lVar11 + -1;
  }
  if (pIVar17 != (ImDrawCmd *)0x0) {
    iVar20 = pIVar17->ElemCount + pIVar17->IdxOffset;
  }
  iVar16 = 0;
  iVar18 = 0;
  if (1 < this->_Count) {
    iVar18 = 0;
    lVar11 = 1;
    iVar16 = 0;
    do {
      if ((this->_Channels).Size <= lVar11) goto LAB_0018c0e7;
      pIVar3 = (this->_Channels).Data;
      pIVar4 = pIVar3 + lVar11;
      iVar14 = pIVar3[lVar11]._CmdBuffer.Size;
      if ((0 < (long)iVar14) && ((pIVar4->_CmdBuffer).Data[(long)iVar14 + -1].ElemCount == 0)) {
        (pIVar4->_CmdBuffer).Size = iVar14 + -1;
      }
      lVar12 = (long)(pIVar4->_CmdBuffer).Size;
      if ((0 < lVar12) && (pIVar17 != (ImDrawCmd *)0x0)) {
        pIVar13 = (pIVar4->_CmdBuffer).Data;
        auVar5 = vpor_avx((undefined1  [16])pIVar17->ClipRect ^ (undefined1  [16])pIVar13->ClipRect,
                          *(undefined1 (*) [16])&(pIVar17->ClipRect).w ^
                          *(undefined1 (*) [16])&(pIVar13->ClipRect).w);
        if ((auVar5 == (undefined1  [16])0x0) &&
           (pIVar13->UserCallback == (ImDrawCallback)0x0 &&
            pIVar17->UserCallback == (ImDrawCallback)0x0)) {
          pIVar17->ElemCount = pIVar17->ElemCount + pIVar13->ElemCount;
          iVar20 = iVar20 + pIVar13->ElemCount;
          memmove(pIVar13,pIVar13 + 1,lVar12 * 0x38 - 0x38);
          (pIVar4->_CmdBuffer).Size = (pIVar4->_CmdBuffer).Size + -1;
        }
      }
      iVar14 = (pIVar4->_CmdBuffer).Size;
      lVar12 = (long)iVar14;
      if (0 < lVar12) {
        pIVar17 = (pIVar4->_CmdBuffer).Data + lVar12 + -1;
      }
      iVar16 = iVar16 + (pIVar4->_IdxBuffer).Size;
      if (0 < iVar14) {
        pIVar13 = (pIVar4->_CmdBuffer).Data;
        lVar15 = 0;
        do {
          *(int *)((long)&pIVar13->IdxOffset + lVar15) = iVar20;
          iVar20 = iVar20 + *(int *)((long)&pIVar13->ElemCount + lVar15);
          lVar15 = lVar15 + 0x38;
        } while (lVar12 * 0x38 - lVar15 != 0);
      }
      iVar18 = iVar18 + iVar14;
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->_Count);
  }
  iVar14 = (draw_list->CmdBuffer).Size + iVar18;
  iVar20 = (draw_list->CmdBuffer).Capacity;
  if (iVar20 < iVar14) {
    if (iVar20 == 0) {
      iVar19 = 8;
    }
    else {
      iVar19 = iVar20 / 2 + iVar20;
    }
    if (iVar19 <= iVar14) {
      iVar19 = iVar14;
    }
    if (iVar20 < iVar19) {
      pIVar13 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar19 * 0x38);
      pIVar17 = (draw_list->CmdBuffer).Data;
      if (pIVar17 != (ImDrawCmd *)0x0) {
        memcpy(pIVar13,pIVar17,(long)(draw_list->CmdBuffer).Size * 0x38);
        ImGui::MemFree((draw_list->CmdBuffer).Data);
      }
      (draw_list->CmdBuffer).Data = pIVar13;
      (draw_list->CmdBuffer).Capacity = iVar19;
    }
  }
  (draw_list->CmdBuffer).Size = iVar14;
  lVar11 = (long)(draw_list->IdxBuffer).Size + (long)iVar16;
  iVar20 = (draw_list->IdxBuffer).Capacity;
  iVar14 = (int)lVar11;
  if (iVar20 < iVar14) {
    if (iVar20 == 0) {
      iVar19 = 8;
    }
    else {
      iVar19 = iVar20 / 2 + iVar20;
    }
    if (iVar19 <= iVar14) {
      iVar19 = iVar14;
    }
    if (iVar20 < iVar19) {
      __dest = (unsigned_short *)ImGui::MemAlloc((long)iVar19 * 2);
      __src = (draw_list->IdxBuffer).Data;
      if (__src != (unsigned_short *)0x0) {
        memcpy(__dest,__src,(long)(draw_list->IdxBuffer).Size * 2);
        ImGui::MemFree((draw_list->IdxBuffer).Data);
      }
      (draw_list->IdxBuffer).Data = __dest;
      (draw_list->IdxBuffer).Capacity = iVar19;
    }
  }
  (draw_list->IdxBuffer).Size = iVar14;
  local_40 = (draw_list->IdxBuffer).Data + (lVar11 - iVar16);
  if (1 < this->_Count) {
    pIVar17 = (draw_list->CmdBuffer).Data + ((long)(draw_list->CmdBuffer).Size - (long)iVar18);
    lVar12 = 1;
    lVar11 = 0x38;
    do {
      if ((this->_Channels).Size <= lVar12) {
LAB_0018c0e7:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                      ,0x66a,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
      }
      pIVar4 = (this->_Channels).Data;
      lVar15 = (long)*(int *)((long)pIVar4 + lVar11 + -0x18);
      if (lVar15 != 0) {
        memcpy(pIVar17,*(void **)((long)pIVar4 + lVar11 + -0x10),lVar15 * 0x38);
        pIVar17 = pIVar17 + lVar15;
      }
      lVar15 = (long)*(int *)((long)pIVar4 + lVar11 + -8);
      if (lVar15 != 0) {
        memcpy(local_40,*(void **)((long)&(pIVar4->_CmdBuffer).Size + lVar11),lVar15 * 2);
        local_40 = local_40 + lVar15;
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar12 < this->_Count);
  }
  draw_list->_IdxWritePtr = local_40;
  uVar2 = (draw_list->CmdBuffer).Size;
  if ((ulong)uVar2 != 0) {
    if ((int)uVar2 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                    ,0x674,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    if ((draw_list->CmdBuffer).Data[(ulong)uVar2 - 1].UserCallback == (ImDrawCallback)0x0)
    goto LAB_0018c079;
  }
  ImDrawList::AddDrawCmd(draw_list);
LAB_0018c079:
  pIVar17 = (draw_list->CmdBuffer).Data;
  iVar20 = (draw_list->CmdBuffer).Size;
  pIVar13 = pIVar17 + (long)iVar20 + -1;
  pIVar1 = &draw_list->_CmdHeader;
  if (pIVar17[(long)iVar20 + -1].ElemCount == 0) {
    fVar7 = (pIVar1->ClipRect).x;
    fVar8 = (pIVar1->ClipRect).y;
    fVar9 = (draw_list->_CmdHeader).ClipRect.z;
    fVar10 = (draw_list->_CmdHeader).ClipRect.w;
    uVar6 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
    *(undefined8 *)&pIVar17[(long)iVar20 + -1].ClipRect.w =
         *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
    *(undefined8 *)((long)&pIVar17[(long)iVar20 + -1].TextureId + 4) = uVar6;
    (pIVar13->ClipRect).x = fVar7;
    (pIVar13->ClipRect).y = fVar8;
    pIVar17[(long)iVar20 + -1].ClipRect.z = fVar9;
    pIVar17[(long)iVar20 + -1].ClipRect.w = fVar10;
  }
  else {
    auVar5 = vpor_avx((undefined1  [16])pIVar13->ClipRect ^ (undefined1  [16])pIVar1->ClipRect,
                      *(undefined1 (*) [16])&pIVar17[(long)iVar20 + -1].ClipRect.w ^
                      *(undefined1 (*) [16])&(draw_list->_CmdHeader).ClipRect.w);
    if (auVar5 != (undefined1  [16])0x0) {
      ImDrawList::AddDrawCmd(draw_list);
    }
  }
  this->_Count = 1;
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}